

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

int mixed_queue_clear(mixed_segment *segment)

{
  vector *vector;
  mixed_segment *segment_00;
  int iVar1;
  uint32_t i_1;
  uint uVar2;
  uint32_t i;
  ulong uVar3;
  mixed_segment_info info;
  mixed_segment_info mStack_448;
  
  vector = (vector *)segment->data;
  memset(&mStack_448,0,0x420);
  for (uVar3 = 0; uVar3 < vector->count; uVar3 = uVar3 + 1) {
    segment_00 = (mixed_segment *)vector->data[uVar3];
    mixed_segment_end(segment_00);
    mixed_segment_info(&mStack_448,segment_00);
    for (uVar2 = 0; uVar2 < mStack_448.max_inputs; uVar2 = uVar2 + 1) {
      mixed_segment_set_in(0,uVar2,(void *)0x0,segment_00);
    }
    for (uVar2 = 0; uVar2 < mStack_448.outputs; uVar2 = uVar2 + 1) {
      mixed_segment_set_out(0,uVar2,(void *)0x0,segment_00);
    }
  }
  iVar1 = vector_clear(vector);
  return iVar1;
}

Assistant:

MIXED_EXPORT int mixed_queue_clear(struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  struct mixed_segment_info info = {0};
  
  for(uint32_t i=0; i<data->count; ++i){
    struct mixed_segment *old = data->queue[i];
    mixed_segment_end(old);
    mixed_segment_info(&info, old);
    for(uint32_t i=0; i<info.max_inputs; ++i){
      mixed_segment_set_in(MIXED_BUFFER, i, 0, old);
    }
    for(uint32_t i=0; i<info.outputs; ++i){
      mixed_segment_set_out(MIXED_BUFFER, i, 0, old);
    }
  }
  return vector_clear((struct vector *)data);
}